

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  if (this->pool_->fallback_database_ == (DescriptorDatabase *)0x0) {
    std::operator+(&local_80,"Import \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[index]);
    std::operator+(&local_40,&local_80,"\" has not been loaded.");
  }
  else {
    std::operator+(&local_80,"Import \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[index]);
    std::operator+(&local_40,&local_80,"\" was not found or had errors.");
  }
  std::__cxx11::string::operator=((string *)&message,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  AddError(this,(string *)((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[index],
           &proto->super_Message,IMPORT,&message);
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void DescriptorBuilder::AddImportError(const FileDescriptorProto& proto,
                                       int index) {
  std::string message;
  if (pool_->fallback_database_ == nullptr) {
    message = "Import \"" + proto.dependency(index) + "\" has not been loaded.";
  } else {
    message = "Import \"" + proto.dependency(index) +
              "\" was not found or had errors.";
  }
  AddError(proto.dependency(index), proto,
           DescriptorPool::ErrorCollector::IMPORT, message);
}